

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Get_accumulate
              (void *origin_addr,int origin_count,MPIABI_Datatype origin_datatype,void *result_addr,
              int result_count,MPIABI_Datatype result_datatype,int target_rank,
              MPIABI_Aint target_disp,int target_count,MPIABI_Datatype target_datatype,MPIABI_Op op,
              MPIABI_Win win)

{
  void *pvVar1;
  int iVar2;
  ompi_datatype_t *poVar3;
  ompi_datatype_t *poVar4;
  ompi_datatype_t *poVar5;
  ompi_op_t *poVar6;
  ompi_win_t *poVar7;
  WPI_Handle<ompi_win_t_*> local_78;
  WPI_Handle<ompi_op_t_*> local_70;
  WPI_Handle<ompi_datatype_t_*> local_68;
  WPI_Handle<ompi_datatype_t_*> local_60;
  WPI_Handle<ompi_datatype_t_*> local_58;
  MPIABI_Datatype local_50;
  MPIABI_Datatype result_datatype_local;
  void *pvStack_40;
  int result_count_local;
  void *result_addr_local;
  MPIABI_Datatype origin_datatype_local;
  void *pvStack_28;
  int origin_count_local;
  void *origin_addr_local;
  
  local_50 = result_datatype;
  result_datatype_local._4_4_ = result_count;
  pvStack_40 = result_addr;
  result_addr_local = (void *)origin_datatype;
  origin_datatype_local._4_4_ = origin_count;
  pvStack_28 = origin_addr;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(&local_58,origin_datatype);
  poVar3 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)&local_58);
  pvVar1 = pvStack_40;
  iVar2 = result_datatype_local._4_4_;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(&local_60,local_50);
  poVar4 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)&local_60);
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(&local_68,target_datatype);
  poVar5 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)&local_68);
  WPI_Handle<ompi_op_t_*>::WPI_Handle(&local_70,op);
  poVar6 = WPI_Handle::operator_cast_to_ompi_op_t_((WPI_Handle *)&local_70);
  WPI_Handle<ompi_win_t_*>::WPI_Handle(&local_78,win);
  poVar7 = WPI_Handle::operator_cast_to_ompi_win_t_((WPI_Handle *)&local_78);
  iVar2 = MPI_Get_accumulate(origin_addr,origin_count,poVar3,pvVar1,iVar2,poVar4,target_rank,
                             target_disp,target_count,poVar5,poVar6,poVar7);
  return iVar2;
}

Assistant:

int MPIABI_Get_accumulate(
  const void * origin_addr,
  int origin_count,
  MPIABI_Datatype origin_datatype,
  void * result_addr,
  int result_count,
  MPIABI_Datatype result_datatype,
  int target_rank,
  MPIABI_Aint target_disp,
  int target_count,
  MPIABI_Datatype target_datatype,
  MPIABI_Op op,
  MPIABI_Win win
) {
  return MPI_Get_accumulate(
    origin_addr,
    origin_count,
    (MPI_Datatype)(WPI_Datatype)origin_datatype,
    result_addr,
    result_count,
    (MPI_Datatype)(WPI_Datatype)result_datatype,
    target_rank,
    (MPI_Aint)(WPI_Aint)target_disp,
    target_count,
    (MPI_Datatype)(WPI_Datatype)target_datatype,
    (MPI_Op)(WPI_Op)op,
    (MPI_Win)(WPI_Win)win
  );
}